

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Mem * columnMem(sqlite3_stmt *pStmt,int i)

{
  sqlite3 *db;
  undefined1 *puVar1;
  
  puVar1 = columnNullValue_nullMem;
  if (pStmt != (sqlite3_stmt *)0x0) {
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
    if ((*(long *)(pStmt + 0xa0) == 0) || ((uint)*(ushort *)(pStmt + 0xc0) <= (uint)i)) {
      db = *(sqlite3 **)pStmt;
      db->errCode = 0x19;
      sqlite3ErrorFinish(db,0x19);
    }
    else {
      puVar1 = (undefined1 *)(*(long *)(pStmt + 0xa0) + (ulong)(uint)i * 0x38);
    }
  }
  return (Mem *)puVar1;
}

Assistant:

static Mem *columnMem(sqlite3_stmt *pStmt, int i){
  Vdbe *pVm;
  Mem *pOut;

  pVm = (Vdbe *)pStmt;
  if( pVm==0 ) return (Mem*)columnNullValue();
  assert( pVm->db );
  sqlite3_mutex_enter(pVm->db->mutex);
  if( pVm->pResultSet!=0 && i<pVm->nResColumn && i>=0 ){
    pOut = &pVm->pResultSet[i];
  }else{
    sqlite3Error(pVm->db, SQLITE_RANGE);
    pOut = (Mem*)columnNullValue();
  }
  return pOut;
}